

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fontgen.cpp
# Opt level: O2

void generate_image(vector<Glyph,_std::allocator<Glyph>_> *glyphs,int font_height,int border,
                   int image_width,int image_height,string *pgm_filename,string *metadata_filename)

{
  Bitmap *source;
  int x_pos;
  ostream *poVar1;
  Glyph *glyph;
  pointer pGVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Bitmap image_bitmap;
  string local_250;
  ofstream metadata;
  
  std::ofstream::ofstream((ostream *)&metadata,(metadata_filename->_M_dataplus)._M_p,_S_out);
  poVar1 = std::operator<<((ostream *)&metadata,"(pingus-font");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&metadata,"  (size ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,font_height);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&metadata,"  (glyph-count ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&metadata,"  (glyphs ");
  std::endl<char,std::char_traits<char>>(poVar1);
  Bitmap::Bitmap(&image_bitmap,image_width,image_height);
  std::
  __sort<__gnu_cxx::__normal_iterator<Glyph*,std::vector<Glyph,std::allocator<Glyph>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Glyph_const&,Glyph_const&)>>
            ((glyphs->super__Vector_base<Glyph,_std::allocator<Glyph>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (glyphs->super__Vector_base<Glyph,_std::allocator<Glyph>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_Glyph_&,_const_Glyph_&)>)0x105786);
  x_pos = border * 2;
  iVar5 = 0;
  iVar3 = 0;
  iVar4 = 0;
  for (pGVar2 = (glyphs->super__Vector_base<Glyph,_std::allocator<Glyph>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pGVar2 != (glyphs->super__Vector_base<Glyph,_std::allocator<Glyph>_>)._M_impl.
                super__Vector_impl_data._M_finish; pGVar2 = pGVar2 + 1) {
    source = pGVar2->bitmap;
    if (image_bitmap.width < iVar4 + x_pos + source->width) {
      iVar3 = iVar3 + iVar5 + x_pos;
      iVar5 = source->height;
      Bitmap::blit(&image_bitmap,source,x_pos,iVar3 + border);
      iVar4 = border;
    }
    else {
      if (iVar5 <= source->height) {
        iVar5 = source->height;
      }
      Bitmap::blit(&image_bitmap,source,iVar4 + border,iVar3 + border);
    }
    poVar1 = std::operator<<((ostream *)&metadata,"    (glyph ");
    poVar1 = std::operator<<(poVar1,"(unicode ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,") ");
    poVar1 = std::operator<<(poVar1,"(offset ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,pGVar2->x_offset);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,pGVar2->y_offset);
    poVar1 = std::operator<<(poVar1,") ");
    poVar1 = std::operator<<(poVar1,"(advance ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,pGVar2->advance);
    poVar1 = std::operator<<(poVar1,") ");
    poVar1 = std::operator<<(poVar1,"(rect ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,pGVar2->bitmap->width + iVar4 + x_pos);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3 + x_pos + pGVar2->bitmap->height);
    poVar1 = std::operator<<(poVar1,")");
    poVar1 = std::operator<<(poVar1,")");
    poVar1 = std::operator<<(poVar1," ;; ");
    unicode_to_utf8_abi_cxx11_(&local_250,pGVar2->charcode);
    poVar1 = std::operator<<(poVar1,(string *)&local_250);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_250);
    iVar4 = iVar4 + x_pos + pGVar2->bitmap->width;
  }
  poVar1 = std::operator<<((ostream *)&metadata,"  ))");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&metadata,";; EOF ;;");
  std::endl<char,std::char_traits<char>>(poVar1);
  Bitmap::truncate_height(&image_bitmap,iVar3 + border + iVar5);
  Bitmap::write_pgm(&image_bitmap,pgm_filename);
  poVar1 = std::operator<<((ostream *)&std::cout,"ImageSize: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,image_bitmap.width);
  poVar1 = std::operator<<(poVar1,"x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,image_bitmap.height);
  std::endl<char,std::char_traits<char>>(poVar1);
  Bitmap::~Bitmap(&image_bitmap);
  std::ofstream::~ofstream(&metadata);
  return;
}

Assistant:

void generate_image(std::vector<Glyph>& glyphs,
                    int font_height,
                    int border,
                    int image_width,
                    int image_height,
                    const std::string& pgm_filename,
                    const std::string& metadata_filename)
{
  std::ofstream metadata(metadata_filename.c_str());

  metadata << "(pingus-font" << std::endl;
  metadata << "  (size " << font_height << ")" << std::endl;
  metadata << "  (glyph-count " << glyphs.size() << ")" << std::endl;
  metadata << "  (glyphs " << std::endl;

  Bitmap image_bitmap(image_width, image_height); // FIXME: hardcoded height is evil

  int x_pos = 0;
  int y_pos = 0;
  int row_height = 0;

  std::sort(glyphs.begin(), glyphs.end(), glyhp_height_sorter);

  for(std::vector<Glyph>::iterator i = glyphs.begin(); i != glyphs.end(); ++i)
  {
    Glyph& glyph = *i;

    if (x_pos + glyph.bitmap->get_width() + 2*border > image_bitmap.get_width())
    {
      x_pos = border;
      y_pos += row_height + 2*border;
      row_height = glyph.bitmap->get_height();

      image_bitmap.blit(*glyph.bitmap, x_pos+border, y_pos+border);
    }
    else
    {
      row_height = std::max(row_height, glyph.bitmap->get_height());

      image_bitmap.blit(*glyph.bitmap, x_pos+border, y_pos+border);
    }

    metadata << "    (glyph "
	     << "(unicode " << glyph.charcode << ") "
	     << "(offset " << glyph.x_offset << " " << glyph.y_offset << ") "
	     << "(advance " << glyph.advance << ") "
	     << "(rect "
	     << x_pos << " " << y_pos << " "
	     << x_pos+glyph.bitmap->get_width()+border*2 << " " << y_pos+glyph.bitmap->get_height()+border*2 << ")"
	     << ")"
	     << " ;; " << unicode_to_utf8(glyph.charcode)
	     << std::endl;

    x_pos += glyph.bitmap->get_width() + 2*border;
  }

  metadata << "  ))" << std::endl;
  metadata << ";; EOF ;;" << std::endl;

  image_bitmap.truncate_height(y_pos + row_height + border);
  image_bitmap.write_pgm(pgm_filename);
  std::cout << "ImageSize: " << image_bitmap.get_width() << "x" << image_bitmap.get_height() << std::endl;
}